

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O0

void __thiscall PyClientDMLSession::on_invalid_packet(PyClientDMLSession *this)

{
  bool bVar1;
  object local_40;
  object o;
  handle local_28;
  function overload;
  gil_scoped_acquire gil;
  PyClientDMLSession *this_local;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<ki::protocol::net::ClientDMLSession>
            ((pybind11 *)&local_28,&this->super_ClientDMLSession,"on_invalid_packet");
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_28);
  if (bVar1) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_40);
    pybind11::detail::cast_safe<void>(&local_40);
    pybind11::object::~object(&local_40);
  }
  pybind11::function::~function((function *)&local_28);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (!bVar1) {
    ki::protocol::net::Session::on_invalid_packet
              ((Session *)
               ((long)&(this->super_ClientDMLSession).super_ClientSession._vptr_ClientSession +
               (long)(this->super_ClientDMLSession).super_ClientSession._vptr_ClientSession[-3]));
  }
  return;
}

Assistant:

PYBIND11_OVERLOAD(
            void, ki::protocol::net::ClientDMLSession,
            on_invalid_packet, );
    }
    void send_packet_data(const char *data, const size_t size) override
    {
        PYBIND11_OVERLOAD_PURE(
            void, ki::protocol::net::ClientDMLSession,
            send_packet_data, py::bytes(data, size), size);
    }